

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextEditState::OnKeyPressed(ImGuiTextEditState *this,int key)

{
  STB_TexteditState *state;
  ulong uVar1;
  ImWchar *pIVar2;
  float fVar3;
  uchar uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  unsigned_short *puVar14;
  float fVar15;
  StbUndoRecord *pSVar16;
  bool bVar17;
  short sVar18;
  int temp;
  int iVar19;
  int iVar20;
  uint uVar21;
  int n_3;
  uint uVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  ImGuiStb *pIVar26;
  long lVar27;
  int n_1;
  ImGuiTextEditState *str;
  short *psVar28;
  int iVar29;
  ulong uVar30;
  undefined8 in_R8;
  uint uVar31;
  bool bVar32;
  float fVar33;
  ImWchar *text_remaining;
  StbFindState find;
  ImWchar *local_50;
  ImWchar local_48 [6];
  int local_3c;
  int local_38;
  int local_34;
  
  state = &this->StbState;
  uVar4 = (this->StbState).single_line;
LAB_001946c1:
  switch(key) {
  case 0x10000:
    goto switchD_001946d4_caseD_10000;
  case 0x10001:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      (this->StbState).cursor = (this->StbState).cursor + 1;
      iVar19 = this->CurLenW;
    }
    else {
      ImGuiStb::stb_textedit_move_to_last(this,state);
      iVar19 = this->CurLenW;
      iVar24 = (this->StbState).select_start;
      iVar20 = (this->StbState).select_end;
      if (iVar24 != iVar20) {
        if (iVar19 < iVar24) {
          (this->StbState).select_start = iVar19;
          iVar24 = iVar19;
        }
        if (iVar19 < iVar20) {
          (this->StbState).select_end = iVar19;
          iVar20 = iVar19;
        }
        if (iVar24 == iVar20) {
          state->cursor = iVar24;
        }
      }
    }
    if (iVar19 < state->cursor) goto LAB_00194de1;
    goto LAB_00195443;
  case 0x10002:
switchD_001946d4_caseD_10002:
    if (uVar4 == '\0') {
      uVar31 = (this->StbState).select_start;
      str = (ImGuiTextEditState *)(ulong)uVar31;
      uVar21 = (this->StbState).select_end;
      if ((key & 0x20000U) == 0) {
        if (uVar31 == uVar21) {
          str = (ImGuiTextEditState *)(ulong)(uint)state->cursor;
        }
        else {
          if ((int)uVar21 < (int)uVar31) {
            (this->StbState).select_start = uVar21;
            str = (ImGuiTextEditState *)(ulong)uVar21;
          }
          (this->StbState).cursor = (int)str;
          (this->StbState).select_end = (int)str;
          (this->StbState).has_preferred_x = '\0';
        }
LAB_00194f11:
        uVar22 = this->CurLenW;
      }
      else {
        if (uVar31 == uVar21) {
          uVar31 = (this->StbState).cursor;
          str = (ImGuiTextEditState *)(ulong)uVar31;
          (this->StbState).select_end = uVar31;
          (this->StbState).select_start = uVar31;
          goto LAB_00194f11;
        }
        (this->StbState).cursor = uVar21;
        uVar22 = this->CurLenW;
        if ((int)uVar22 < (int)uVar31) {
          (this->StbState).select_start = uVar22;
          str = (ImGuiTextEditState *)(ulong)uVar22;
        }
        uVar31 = uVar21;
        if ((int)uVar22 < (int)uVar21) {
          (this->StbState).select_end = uVar22;
          uVar31 = uVar22;
        }
        if ((uint)str == uVar31) {
          state->cursor = (uint)str;
        }
        else {
          str = (ImGuiTextEditState *)(ulong)uVar21;
        }
      }
      if ((int)uVar22 < (int)str) {
        state->cursor = uVar22;
        str = (ImGuiTextEditState *)(ulong)uVar22;
      }
      ImGuiStb::stb_textedit_find_charpos
                ((ImGuiStb *)local_48,(StbFindState *)this,str,0,(int)in_R8);
      if (local_34 == local_3c) goto LAB_00195447;
      pIVar26 = (ImGuiStb *)&(this->StbState).preferred_x;
      if ((this->StbState).has_preferred_x == '\0') {
        pIVar26 = (ImGuiStb *)local_48;
      }
      fVar3 = *(float *)pIVar26;
      (this->StbState).cursor = local_34;
      puVar14 = (this->Text).Data;
      local_50 = (ImWchar *)0x0;
      pIVar2 = puVar14 + local_34;
      InputTextCalcTextSizeW(pIVar2,puVar14 + this->CurLenW,&local_50,(ImVec2 *)0x1,SUB81(in_R8,0));
      iVar19 = (int)((ulong)((long)local_50 - (long)pIVar2) >> 1);
      if (iVar19 < 1) goto LAB_00194fe0;
      iVar24 = 0;
      fVar15 = 0.0;
      goto LAB_00194fa6;
    }
    key = key & 0x20000U | 0x10000;
    goto LAB_001946c1;
  case 0x10003:
switchD_001946d4_caseD_10003:
    if (uVar4 != '\0') goto code_r0x00194712;
    uVar31 = (this->StbState).select_start;
    uVar21 = (this->StbState).select_end;
    if ((key & 0x20000U) == 0) {
      if (uVar31 == uVar21) goto LAB_00194c7a;
      ImGuiStb::stb_textedit_move_to_last(this,state);
      uVar31 = (this->StbState).select_start;
      uVar21 = (this->StbState).select_end;
LAB_00194dfc:
      uVar22 = this->CurLenW;
      if (uVar31 != uVar21) {
        if ((int)uVar22 < (int)uVar31) {
          (this->StbState).select_start = uVar22;
          uVar31 = uVar22;
        }
        if ((int)uVar22 < (int)uVar21) {
          (this->StbState).select_end = uVar22;
          uVar21 = uVar22;
        }
        if (uVar31 == uVar21) {
          state->cursor = uVar31;
        }
      }
    }
    else {
      if (uVar31 != uVar21) {
        state->cursor = uVar21;
        goto LAB_00194dfc;
      }
      iVar19 = (this->StbState).cursor;
      (this->StbState).select_end = iVar19;
      (this->StbState).select_start = iVar19;
LAB_00194c7a:
      uVar22 = this->CurLenW;
    }
    uVar31 = state->cursor;
    if ((int)uVar22 < state->cursor) {
      state->cursor = uVar22;
      uVar31 = uVar22;
    }
    ImGuiStb::stb_textedit_find_charpos
              ((ImGuiStb *)local_48,(StbFindState *)this,(ImGuiTextEditState *)(ulong)uVar31,
               (uint)(this->StbState).single_line,(int)in_R8);
    if ((long)local_38 == 0) goto LAB_00195447;
    pIVar26 = (ImGuiStb *)&(this->StbState).preferred_x;
    if ((this->StbState).has_preferred_x == '\0') {
      pIVar26 = (ImGuiStb *)local_48;
    }
    fVar3 = *(float *)pIVar26;
    lVar25 = (long)local_3c + (long)local_38;
    iVar19 = (int)lVar25;
    (this->StbState).cursor = iVar19;
    puVar14 = (this->Text).Data;
    local_50 = (ImWchar *)0x0;
    pIVar2 = puVar14 + lVar25;
    InputTextCalcTextSizeW(pIVar2,puVar14 + this->CurLenW,&local_50,(ImVec2 *)0x1,SUB81(in_R8,0));
    iVar24 = (int)((ulong)((long)local_50 - (long)pIVar2) >> 1);
    if (iVar24 < 1) goto LAB_00194fe0;
    fVar15 = 0.0;
    iVar20 = 0;
    goto LAB_00194eba;
  case 0x10004:
    uVar31 = this->CurLenW;
    uVar21 = (this->StbState).select_start;
    uVar22 = (this->StbState).select_end;
    uVar23 = uVar21;
    if (uVar21 != uVar22) {
      if ((int)uVar31 < (int)uVar21) {
        (this->StbState).select_start = uVar31;
        uVar21 = uVar31;
      }
      if ((int)uVar31 < (int)uVar22) {
        (this->StbState).select_end = uVar31;
        uVar22 = uVar31;
      }
      uVar23 = uVar22;
      if (uVar21 == uVar22) {
        state->cursor = uVar21;
        uVar23 = uVar21;
      }
    }
    uVar22 = state->cursor;
    if ((int)uVar31 < state->cursor) {
      state->cursor = uVar31;
      uVar22 = uVar31;
    }
    if (uVar21 != uVar23) {
      uVar22 = uVar21;
      if ((int)uVar23 < (int)uVar21) {
        (this->StbState).select_start = uVar23;
        uVar22 = uVar23;
      }
      (this->StbState).cursor = uVar22;
      (this->StbState).select_end = uVar22;
      (this->StbState).has_preferred_x = '\0';
    }
    if (uVar4 != '\0') {
      state->cursor = 0;
      goto LAB_00195443;
    }
    if ((int)uVar22 < 1) goto LAB_00195443;
    if ((this->Text).Size < (int)uVar22) goto LAB_00195467;
    puVar14 = (this->Text).Data;
    uVar30 = (ulong)uVar22;
    goto LAB_001950ff;
  case 0x10005:
    iVar19 = this->CurLenW;
    iVar24 = (this->StbState).select_start;
    iVar20 = (this->StbState).select_end;
    iVar29 = iVar24;
    if (iVar24 != iVar20) {
      if (iVar19 < iVar24) {
        (this->StbState).select_start = iVar19;
        iVar24 = iVar19;
      }
      if (iVar19 < iVar20) {
        (this->StbState).select_end = iVar19;
        iVar20 = iVar19;
      }
      iVar29 = iVar20;
      if (iVar24 == iVar20) {
        state->cursor = iVar24;
        iVar29 = iVar24;
      }
    }
    iVar20 = state->cursor;
    if (iVar19 < state->cursor) {
      state->cursor = iVar19;
      iVar20 = iVar19;
    }
    if (iVar24 != iVar29) {
      iVar20 = iVar24;
      if (iVar29 < iVar24) {
        (this->StbState).select_start = iVar29;
        iVar20 = iVar29;
      }
      (this->StbState).cursor = iVar20;
      (this->StbState).select_end = iVar20;
      (this->StbState).has_preferred_x = '\0';
    }
    if (uVar4 != '\0') {
      state->cursor = iVar19;
      goto LAB_00195443;
    }
    if (iVar19 <= iVar20) goto LAB_00195443;
    iVar24 = (this->Text).Size;
    if (iVar24 <= iVar20) {
      iVar24 = iVar20;
    }
    puVar14 = (this->Text).Data;
    lVar25 = 0;
    goto LAB_0019514a;
  case 0x10006:
    (this->StbState).select_end = 0;
    (this->StbState).cursor = 0;
    (this->StbState).select_start = 0;
    goto LAB_00195443;
  case 0x10007:
    (this->StbState).cursor = this->CurLenW;
    (this->StbState).select_start = 0;
    (this->StbState).select_end = 0;
    goto LAB_00195443;
  case 0x10008:
switchD_001946d4_caseD_10008:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      iVar19 = (this->StbState).cursor;
      if (iVar19 < this->CurLenW) {
        ImGuiStb::stb_textedit_delete(this,state,iVar19,1);
      }
      goto LAB_00195443;
    }
    break;
  case 0x10009:
switchD_001946d4_caseD_10009:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      iVar19 = this->CurLenW;
      iVar24 = (this->StbState).cursor;
      if (iVar19 < iVar24) {
        state->cursor = iVar19;
        iVar24 = iVar19;
      }
      if (0 < iVar24) {
        ImGuiStb::stb_textedit_delete(this,state,iVar24 + -1,1);
        (this->StbState).cursor = (this->StbState).cursor + -1;
      }
      goto LAB_00195443;
    }
    break;
  case 0x1000a:
    lVar25 = (long)(this->StbState).undostate.undo_point;
    if (lVar25 == 0) goto LAB_00195443;
    iVar19 = (this->StbState).undostate.undo_rec[lVar25 + -1].where;
    sVar5 = (this->StbState).undostate.undo_rec[lVar25 + -1].insert_length;
    iVar24 = (int)sVar5;
    sVar6 = (this->StbState).undostate.undo_rec[lVar25 + -1].delete_length;
    uVar31 = (uint)sVar6;
    sVar7 = (this->StbState).undostate.undo_rec[lVar25 + -1].char_storage;
    uVar30 = (ulong)(this->StbState).undostate.redo_point;
    (this->StbState).undostate.undo_rec[uVar30 - 1].char_storage = -1;
    (this->StbState).undostate.undo_rec[uVar30 - 1].insert_length = sVar6;
    (this->StbState).undostate.undo_rec[uVar30 - 1].delete_length = sVar5;
    (this->StbState).undostate.undo_rec[uVar30 - 1].where = iVar19;
    if (sVar6 == 0) goto LAB_001953f5;
    if ((int)((int)(this->StbState).undostate.undo_char_point + uVar31) < 999) goto LAB_001951d0;
    (this->StbState).undostate.undo_rec[uVar30 - 1].insert_length = 0;
    goto LAB_001953da;
  case 0x1000b:
    lVar25 = (long)(this->StbState).undostate.redo_point;
    if (lVar25 == 99) goto LAB_00195443;
    sVar5 = (this->StbState).undostate.undo_point;
    iVar19 = (this->StbState).undostate.undo_rec[lVar25].where;
    sVar6 = (this->StbState).undostate.undo_rec[lVar25].insert_length;
    iVar24 = (int)sVar6;
    sVar7 = (this->StbState).undostate.undo_rec[lVar25].delete_length;
    sVar8 = (this->StbState).undostate.undo_rec[lVar25].char_storage;
    (this->StbState).undostate.undo_rec[sVar5].delete_length = sVar6;
    (this->StbState).undostate.undo_rec[sVar5].insert_length = sVar7;
    (this->StbState).undostate.undo_rec[sVar5].where = iVar19;
    (this->StbState).undostate.undo_rec[sVar5].char_storage = -1;
    if (sVar7 == 0) goto LAB_0019531f;
    sVar18 = (this->StbState).undostate.undo_char_point;
    if ((int)(this->StbState).undostate.redo_char_point < (int)sVar18 + (int)sVar7) {
      pSVar16 = (this->StbState).undostate.undo_rec + sVar5;
      pSVar16->insert_length = 0;
      pSVar16->delete_length = 0;
      goto LAB_00195314;
    }
    (this->StbState).undostate.undo_rec[sVar5].char_storage = sVar18;
    (this->StbState).undostate.undo_char_point = sVar18 + sVar7;
    if (sVar7 < 1) goto LAB_00195314;
    iVar20 = (this->Text).Size;
    if (iVar20 < iVar19) {
      iVar20 = iVar19;
    }
    puVar14 = (this->Text).Data;
    uVar30 = 0;
    goto LAB_001952e8;
  case 0x1000c:
    iVar19 = (this->StbState).select_start;
    iVar24 = (this->StbState).select_end;
    bVar32 = SBORROW4(iVar19,iVar24);
    iVar20 = iVar19 - iVar24;
    bVar17 = iVar19 == iVar24;
    if (!bVar17) goto LAB_00194a18;
    iVar19 = state->cursor;
    goto LAB_001949c2;
  case 0x1000d:
    if ((this->StbState).select_start != (this->StbState).select_end) {
      ImGuiStb::stb_textedit_move_to_last(this,state);
      goto LAB_00195447;
    }
    iVar19 = this->CurLenW;
    iVar24 = (this->StbState).cursor;
    goto LAB_00194a3e;
  default:
    switch(key) {
    case 0x30000:
      iVar19 = this->CurLenW;
      iVar20 = (this->StbState).select_start;
      iVar24 = (this->StbState).select_end;
      if (iVar20 == iVar24) {
        iVar20 = state->cursor;
LAB_00194d74:
        iVar24 = iVar19;
        if (iVar20 < iVar19) {
          iVar24 = iVar20;
        }
        (this->StbState).select_end = iVar24;
        (this->StbState).select_start = iVar24;
      }
      else {
        if (iVar19 < iVar20) {
          (this->StbState).select_start = iVar19;
          iVar20 = iVar19;
        }
        if (iVar19 < iVar24) {
          (this->StbState).select_end = iVar19;
          iVar24 = iVar19;
        }
        if (iVar20 == iVar24) goto LAB_00194d74;
      }
      if (0 < iVar24) {
        iVar24 = iVar24 + -1;
        (this->StbState).select_end = iVar24;
      }
      (this->StbState).cursor = iVar24;
      goto LAB_00195443;
    case 0x30001:
      iVar19 = (this->StbState).select_start;
      iVar24 = (this->StbState).select_end;
      if (iVar19 == iVar24) {
        iVar19 = (this->StbState).cursor;
        (this->StbState).select_start = iVar19;
        iVar24 = iVar19;
      }
      iVar20 = iVar24 + 1;
      (this->StbState).select_end = iVar20;
      if (iVar19 != iVar20) {
        iVar29 = this->CurLenW;
        if (iVar29 < iVar19) {
          (this->StbState).select_start = iVar29;
        }
        iVar19 = iVar20;
        if (iVar29 <= iVar24) {
          (this->StbState).select_end = iVar29;
          iVar19 = iVar29;
        }
      }
      (this->StbState).cursor = iVar19;
      goto LAB_00195443;
    case 0x30002:
      goto switchD_001946d4_caseD_10002;
    case 0x30003:
      goto switchD_001946d4_caseD_10003;
    case 0x30004:
      uVar31 = this->CurLenW;
      uVar21 = (this->StbState).select_start;
      uVar22 = (this->StbState).select_end;
      uVar23 = uVar21;
      if (uVar21 != uVar22) {
        if ((int)uVar31 < (int)uVar21) {
          (this->StbState).select_start = uVar31;
          uVar21 = uVar31;
        }
        if ((int)uVar31 < (int)uVar22) {
          (this->StbState).select_end = uVar31;
          uVar22 = uVar31;
        }
        uVar23 = uVar22;
        if (uVar21 == uVar22) {
          state->cursor = uVar21;
          uVar23 = uVar21;
        }
      }
      uVar22 = state->cursor;
      if ((int)uVar31 < state->cursor) {
        state->cursor = uVar31;
        uVar22 = uVar31;
      }
      if (uVar21 == uVar23) {
        (this->StbState).select_end = uVar22;
        (this->StbState).select_start = uVar22;
        uVar23 = uVar22;
      }
      else {
        state->cursor = uVar23;
      }
      uVar31 = 0;
      if (uVar4 != '\0') goto LAB_00194d36;
      if ((int)uVar23 < 1) goto LAB_00194d3b;
      if ((this->Text).Size < (int)uVar23) goto LAB_00195467;
      puVar14 = (this->Text).Data;
      uVar30 = (ulong)uVar23;
      if (puVar14[(ulong)uVar23 - 1] == 10) goto LAB_00194d3b;
      goto LAB_00195081;
    case 0x30005:
      iVar19 = this->CurLenW;
      iVar24 = (this->StbState).select_start;
      iVar20 = (this->StbState).select_end;
      iVar29 = iVar24;
      if (iVar24 != iVar20) {
        if (iVar19 < iVar24) {
          (this->StbState).select_start = iVar19;
          iVar24 = iVar19;
        }
        if (iVar19 < iVar20) {
          (this->StbState).select_end = iVar19;
          iVar20 = iVar19;
        }
        iVar29 = iVar20;
        if (iVar24 == iVar20) {
          state->cursor = iVar24;
          iVar29 = iVar24;
        }
      }
      iVar20 = state->cursor;
      if (iVar19 < state->cursor) {
        state->cursor = iVar19;
        iVar20 = iVar19;
      }
      if (iVar24 == iVar29) {
        (this->StbState).select_end = iVar20;
        (this->StbState).select_start = iVar20;
        iVar29 = iVar20;
      }
      else {
        state->cursor = iVar29;
      }
      if (uVar4 != '\0') {
        state->cursor = iVar19;
        iVar29 = iVar19;
        goto LAB_00195440;
      }
      if (iVar19 <= iVar29) goto LAB_00195440;
      iVar24 = (this->Text).Size;
      lVar25 = (long)iVar29;
      iVar20 = iVar29;
      if (iVar29 < iVar24) {
        iVar20 = iVar24;
      }
      puVar14 = (this->Text).Data;
      goto LAB_001950bb;
    case 0x30006:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        (this->StbState).select_start = (this->StbState).cursor;
      }
      iVar19 = 0;
      break;
    case 0x30007:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        (this->StbState).select_start = (this->StbState).cursor;
      }
      iVar19 = this->CurLenW;
      break;
    case 0x30008:
      goto switchD_001946d4_caseD_10008;
    case 0x30009:
      goto switchD_001946d4_caseD_10009;
    default:
      uVar30 = 0;
      if (key < 0x10000) {
        uVar30 = (ulong)(uint)key;
      }
      iVar19 = (int)uVar30;
      if (iVar19 < 1) goto LAB_00195447;
      local_48[0] = (ImWchar)uVar30;
      if (iVar19 == 10 && uVar4 != '\0') goto LAB_00195447;
      if ((((this->StbState).insert_mode == '\0') ||
          ((this->StbState).select_start != (this->StbState).select_end)) ||
         (iVar24 = (this->StbState).cursor, this->CurLenW <= iVar24)) {
        ImGuiStb::stb_textedit_delete_selection(this,state);
        bVar17 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,local_48,1);
        if (!bVar17) goto LAB_00195447;
        ImGuiStb::stb_text_createundo(&(this->StbState).undostate,(this->StbState).cursor,0,1);
      }
      else {
        ImGuiStb::stb_text_makeundo_replace
                  (this,state,iVar24,
                   (int)CONCAT71((int7)(uVar30 >> 8),iVar19 != 10 || uVar4 == '\0'),(int)in_R8);
        ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,(this->StbState).cursor,1);
        bVar17 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,local_48,1);
        if (!bVar17) goto LAB_00195447;
      }
      (this->StbState).cursor = (this->StbState).cursor + 1;
      goto LAB_00195443;
    case 0x3000c:
      iVar19 = (this->StbState).cursor;
      if ((this->StbState).select_start == (this->StbState).select_end) {
        (this->StbState).select_end = iVar19;
        (this->StbState).select_start = iVar19;
      }
      goto LAB_0019486e;
    case 0x3000d:
      iVar19 = (this->StbState).cursor;
      if ((this->StbState).select_start == (this->StbState).select_end) {
        (this->StbState).select_end = iVar19;
        (this->StbState).select_start = iVar19;
      }
      iVar24 = this->CurLenW;
      goto LAB_00194910;
    }
    (this->StbState).select_end = iVar19;
    (this->StbState).cursor = iVar19;
    goto LAB_00195443;
  }
  ImGuiStb::stb_textedit_delete_selection(this,state);
  goto LAB_00195443;
  while (iVar20 = ImGuiStb::is_word_boundary_from_right(this,iVar19), iVar20 == 0) {
LAB_00194910:
    iVar19 = iVar19 + 1;
    if (iVar24 <= iVar19) break;
  }
  if (iVar19 < iVar24) {
    iVar24 = iVar19;
  }
  (this->StbState).cursor = iVar24;
  (this->StbState).select_end = iVar24;
  iVar19 = this->CurLenW;
  iVar20 = (this->StbState).select_start;
  if (iVar20 != iVar24) {
    if (iVar19 < iVar20) {
      (this->StbState).select_start = iVar19;
      iVar20 = iVar19;
    }
    iVar29 = iVar24;
    if (iVar19 < iVar24) {
      (this->StbState).select_end = iVar19;
      iVar29 = iVar19;
    }
    if (iVar20 == iVar29) {
      state->cursor = iVar20;
      iVar24 = iVar20;
    }
  }
  if (iVar24 <= iVar19) goto LAB_00195447;
  goto LAB_00194966;
  while (iVar20 = ImGuiStb::is_word_boundary_from_right(this,iVar24), iVar19 = iVar24, iVar20 == 0)
  {
LAB_0019486e:
    iVar24 = iVar19 + -1;
    if (iVar19 < 1) break;
  }
  iVar20 = 0;
  if (0 < iVar24) {
    iVar20 = iVar24;
  }
  (this->StbState).cursor = iVar20;
  (this->StbState).select_end = iVar20;
  iVar19 = this->CurLenW;
  iVar24 = (this->StbState).select_start;
  if (iVar24 != iVar20) {
    if (iVar19 < iVar24) {
      (this->StbState).select_start = iVar19;
      iVar24 = iVar19;
    }
    iVar29 = iVar20;
    if (iVar19 < iVar20) {
      (this->StbState).select_end = iVar19;
      iVar29 = iVar19;
    }
    if (iVar24 == iVar29) {
      state->cursor = iVar24;
      iVar20 = iVar24;
    }
  }
  if (iVar20 <= iVar19) goto LAB_00195447;
LAB_00194966:
  state->cursor = iVar19;
  goto LAB_00195447;
  while( true ) {
    lVar25 = lVar25 + 1;
    state->cursor = iVar29 + 1;
    iVar29 = iVar19;
    if (iVar19 == (int)lVar25) break;
LAB_001950bb:
    if (iVar20 == lVar25) goto LAB_00195467;
    iVar29 = (int)lVar25;
    if (puVar14[lVar25] == 10) break;
  }
LAB_00195440:
  (this->StbState).select_end = iVar29;
  goto LAB_00195443;
  while (uVar1 = uVar30 - 1, lVar25 = uVar30 - 2, uVar30 = uVar1, puVar14[lVar25] != 10) {
LAB_00195081:
    if (uVar30 < 2) goto LAB_00194d36;
  }
  uVar31 = (uint)uVar1;
LAB_00194d36:
  uVar23 = uVar31;
  state->cursor = uVar23;
LAB_00194d3b:
  (this->StbState).select_end = uVar23;
  goto LAB_00195443;
  while (iVar20 = ImGuiStb::is_word_boundary_from_right(this,iVar24), iVar20 == 0) {
LAB_00194a3e:
    iVar24 = iVar24 + 1;
    if (iVar19 <= iVar24) break;
  }
  if (iVar24 < iVar19) {
    iVar19 = iVar24;
  }
  (this->StbState).cursor = iVar19;
  goto LAB_00194a62;
  while (iVar20 = ImGuiStb::is_word_boundary_from_right(this,iVar24), iVar19 = iVar24, iVar20 == 0)
  {
LAB_001949c2:
    iVar24 = iVar19 + -1;
    if (iVar19 < 1) break;
  }
  iVar19 = 0;
  if (0 < iVar24) {
    iVar19 = iVar24;
  }
  (this->StbState).cursor = iVar19;
LAB_00194a62:
  ImGuiStb::stb_textedit_clamp((ImGuiTextEditState *)(ulong)(uint)this->CurLenW,state);
  goto LAB_00195447;
  while( true ) {
    (this->StbState).undostate.undo_char
    [(long)(this->StbState).undostate.undo_rec[sVar5].char_storage + uVar30] =
         puVar14[(long)iVar19 + uVar30];
    uVar30 = uVar30 + 1;
    if ((long)(this->StbState).undostate.undo_rec[sVar5].insert_length <= (long)uVar30) break;
LAB_001952e8:
    if ((uint)(iVar20 - iVar19) == uVar30) goto LAB_00195467;
  }
LAB_00195314:
  ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar19,(int)sVar7);
LAB_0019531f:
  if (sVar6 == 0) {
    iVar24 = 0;
  }
  else {
    ImGuiStb::STB_TEXTEDIT_INSERTCHARS
              (this,iVar19,(this->StbState).undostate.undo_char + sVar8,iVar24);
    psVar28 = &(this->StbState).undostate.redo_char_point;
    *psVar28 = *psVar28 + sVar6;
  }
  (this->StbState).cursor = iVar19 + iVar24;
  uVar10 = (this->StbState).undostate.undo_point;
  uVar12 = (this->StbState).undostate.redo_point;
  (this->StbState).undostate.undo_point = uVar10 + 1;
  (this->StbState).undostate.redo_point = uVar12 + 1;
  goto LAB_00195443;
  while( true ) {
    if (sVar18 < 99) {
      if (-1 < (this->StbState).undostate.undo_rec[0x62].char_storage) {
        sVar9 = (this->StbState).undostate.undo_rec[0x62].insert_length;
        sVar18 = sVar8 + sVar9;
        (this->StbState).undostate.redo_char_point = sVar18;
        pIVar2 = (this->StbState).undostate.undo_char + sVar18;
        memmove(pIVar2,pIVar2 + -(long)sVar9,(long)sVar18 * -2 + 0x7ce);
        sVar18 = (this->StbState).undostate.redo_point;
        lVar25 = (long)sVar18;
        if (lVar25 < 0x62) {
          lVar27 = lVar25 + -0x62;
          psVar28 = &(this->StbState).undostate.undo_rec[lVar25].char_storage;
          do {
            if (-1 < *psVar28) {
              *psVar28 = *psVar28 + sVar9;
            }
            psVar28 = psVar28 + 6;
            lVar27 = lVar27 + 1;
          } while (lVar27 != 0);
        }
      }
      lVar25 = (long)sVar18;
      memmove((this->StbState).undostate.undo_rec + lVar25,
              (this->StbState).undostate.undo_rec + lVar25 + -1,(99 - lVar25) * 0xc);
      uVar21 = *(int *)&(this->StbState).undostate.redo_point + 1;
      uVar30 = (ulong)uVar21;
      (this->StbState).undostate.redo_point = (short)uVar21;
    }
    if ((short)uVar30 == 99) break;
LAB_001951d0:
    iVar20 = (int)(this->StbState).undostate.undo_char_point + uVar31;
    sVar8 = (this->StbState).undostate.redo_char_point;
    sVar18 = (short)uVar30;
    if (iVar20 <= sVar8) {
      (this->StbState).undostate.undo_rec[(long)sVar18 + -1].char_storage = sVar8 - sVar6;
      (this->StbState).undostate.redo_char_point = sVar8 - sVar6;
      if (sVar6 < 1) goto LAB_001953da;
      iVar29 = (this->Text).Size;
      if (iVar29 < iVar19) {
        iVar29 = iVar19;
      }
      puVar14 = (this->Text).Data;
      uVar30 = 0;
      goto LAB_001953b3;
    }
  }
  goto LAB_001953d5;
  while( true ) {
    (this->StbState).undostate.undo_char
    [(long)(this->StbState).undostate.undo_rec[(long)sVar18 + -1].char_storage + uVar30] =
         puVar14[(long)iVar19 + uVar30];
    uVar30 = uVar30 + 1;
    if (uVar31 == uVar30) break;
LAB_001953b3:
    if ((uint)(iVar29 - iVar19) == uVar30) goto LAB_00195467;
  }
LAB_001953d5:
  if (iVar20 <= sVar8) {
LAB_001953da:
    ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar19,uVar31);
LAB_001953f5:
    if (sVar5 == 0) {
      iVar24 = 0;
    }
    else {
      ImGuiStb::STB_TEXTEDIT_INSERTCHARS
                (this,iVar19,(this->StbState).undostate.undo_char + sVar7,iVar24);
      psVar28 = &(this->StbState).undostate.undo_char_point;
      *psVar28 = *psVar28 - sVar5;
    }
    (this->StbState).cursor = iVar19 + iVar24;
    uVar11 = (this->StbState).undostate.undo_point;
    uVar13 = (this->StbState).undostate.redo_point;
    (this->StbState).undostate.undo_point = uVar11 + -1;
    (this->StbState).undostate.redo_point = uVar13 + -1;
  }
  goto LAB_00195443;
  while( true ) {
    state->cursor = iVar20 + 1 + (int)lVar25;
    lVar25 = lVar25 + 1;
    if (iVar19 - iVar20 == (int)lVar25) break;
LAB_0019514a:
    if ((long)iVar24 - (long)iVar20 == lVar25) {
LAB_00195467:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4c1,
                    "const value_type &ImVector<unsigned short>::operator[](int) const [T = unsigned short]"
                   );
    }
    if (puVar14[iVar20 + lVar25] == 10) break;
  }
  goto LAB_00195443;
code_r0x00194712:
  key = key & 0x20000U | 0x10001;
  goto LAB_001946c1;
  while( true ) {
    state->cursor = state->cursor + 1;
    iVar20 = iVar20 + 1;
    if (iVar24 == iVar20) break;
LAB_00194eba:
    fVar33 = ImGuiStb::STB_TEXTEDIT_GETWIDTH(this,iVar19,iVar20);
    if (((fVar33 == -1.0) && (!NAN(fVar33))) || (fVar15 = fVar15 + fVar33, fVar3 < fVar15)) break;
  }
  goto LAB_00194fe0;
  while( true ) {
    state->cursor = state->cursor + 1;
    iVar24 = iVar24 + 1;
    if (iVar19 == iVar24) break;
LAB_00194fa6:
    fVar33 = ImGuiStb::STB_TEXTEDIT_GETWIDTH(this,local_34,iVar24);
    if (((fVar33 == -1.0) && (!NAN(fVar33))) || (fVar15 = fVar15 + fVar33, fVar3 < fVar15)) break;
  }
LAB_00194fe0:
  iVar19 = this->CurLenW;
  iVar24 = (this->StbState).select_start;
  iVar20 = (this->StbState).select_end;
  if (iVar24 != iVar20) {
    if (iVar19 < iVar24) {
      (this->StbState).select_start = iVar19;
      iVar24 = iVar19;
    }
    if (iVar19 < iVar20) {
      (this->StbState).select_end = iVar19;
      iVar20 = iVar19;
    }
    if (iVar24 == iVar20) {
      state->cursor = iVar24;
    }
  }
  iVar24 = state->cursor;
  if (iVar19 < state->cursor) {
    state->cursor = iVar19;
    iVar24 = iVar19;
  }
  (this->StbState).has_preferred_x = '\x01';
  (this->StbState).preferred_x = fVar3;
  if ((key & 0x20000U) != 0) {
    (this->StbState).select_end = iVar24;
  }
  goto LAB_00195447;
switchD_001946d4_caseD_10000:
  iVar19 = (this->StbState).select_start;
  iVar24 = (this->StbState).select_end;
  bVar32 = SBORROW4(iVar19,iVar24);
  iVar20 = iVar19 - iVar24;
  bVar17 = iVar19 == iVar24;
  if (bVar17) {
    if (0 < state->cursor) {
      iVar19 = state->cursor + -1;
LAB_00194de1:
      state->cursor = iVar19;
    }
  }
  else {
LAB_00194a18:
    if (!bVar17 && bVar32 == iVar20 < 0) {
      (this->StbState).select_start = iVar24;
      iVar19 = iVar24;
    }
    (this->StbState).cursor = iVar19;
    (this->StbState).select_end = iVar19;
  }
  goto LAB_00195443;
  while( true ) {
    state->cursor = (int)uVar30 + -1;
    bVar17 = uVar30 < 2;
    uVar30 = uVar30 - 1;
    if (bVar17) break;
LAB_001950ff:
    if (puVar14[uVar30 - 1] == 10) break;
  }
LAB_00195443:
  (this->StbState).has_preferred_x = '\0';
LAB_00195447:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiTextEditState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &StbState, key);
    CursorFollow = true;
    CursorAnimReset();
}